

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> __thiscall
fmt::v8::detail::write<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
          (detail *this,back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,
          basic_string_view<char16_t> s,basic_format_specs<char16_t> *specs)

{
  type tVar1;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar2;
  basic_format_specs<char16_t> *specs_00;
  char16_t *pcVar3;
  size_t size;
  anon_class_16_2_3f014a30 local_30;
  
  specs_00 = (basic_format_specs<char16_t> *)s.size_;
  pcVar3 = s.data_;
  local_30.size = (size_t)pcVar3;
  if (-1 < specs_00->precision) {
    tVar1 = to_unsigned<int>(specs_00->precision);
    if ((char16_t *)(ulong)tVar1 < pcVar3) {
      tVar1 = to_unsigned<int>(specs_00->precision);
      if ((char16_t *)(ulong)tVar1 <= pcVar3) {
        local_30.size = (size_t)(ulong)tVar1;
      }
    }
  }
  pcVar3 = (char16_t *)0x0;
  if (specs_00->width != 0) {
    pcVar3 = (char16_t *)local_30.size;
  }
  local_30.data = (char16_t *)out.container;
  bVar2 = write_padded<(fmt::v8::align::type)1,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::basic_string_view<char16_t>,fmt::v8::basic_format_specs<char16_t>const&)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_>
                    ((back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)this,specs_00,
                     local_30.size,(size_t)pcVar3,&local_30);
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, basic_string_view<Char> s,
                         const basic_format_specs<Char>& specs) -> OutputIt {
  auto data = s.data();
  auto size = s.size();
  if (specs.precision >= 0 && to_unsigned(specs.precision) < size)
    size = code_point_index(s, to_unsigned(specs.precision));
  auto width =
      specs.width != 0 ? compute_width(basic_string_view<Char>(data, size)) : 0;
  return write_padded(out, specs, size, width,
                      [=](reserve_iterator<OutputIt> it) {
                        return copy_str<Char>(data, data + size, it);
                      });
}